

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateInfoSetLocalPort(HelicsFederateInfo fedInfo,char *localPort,HelicsError *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  HelicsFederateInfo pvVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (fedInfo == (HelicsFederateInfo)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a0c8a;
    }
    else {
      bVar4 = *(int *)((long)fedInfo + 0x48) == 0x6bfbbce1;
      pvVar3 = (HelicsFederateInfo)0x0;
      if (bVar4) {
        pvVar3 = fedInfo;
      }
      if (bVar4 || err == (HelicsError *)0x0) goto LAB_001a0c8d;
    }
    err->error_code = -3;
    err->message = "helics Federate info object was not valid";
  }
LAB_001a0c8a:
  pvVar3 = (HelicsFederateInfo)0x0;
LAB_001a0c8d:
  if (pvVar3 != (HelicsFederateInfo)0x0) {
    paVar1 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar1;
    if (localPort == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar2 = strlen(localPort);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,localPort,localPort + sVar2);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)pvVar3 + 0x160),&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void helicsFederateInfoSetLocalPort(HelicsFederateInfo fedInfo, const char* localPort, HelicsError* err)
{
    auto* info = getFedInfo(fedInfo, err);
    if (info == nullptr) {
        return;
    }
    info->localport = AS_STRING(localPort);
}